

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  undefined1 auVar21 [16];
  int iVar22;
  long in_FS_OFFSET;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar45;
  undefined8 in_XMM0_Qb;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar44;
  float fVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar47;
  float fVar59;
  float fVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  undefined1 auVar58 [16];
  undefined4 uVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Point3f PVar88;
  float local_1bc;
  uint local_1b8;
  float local_1a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  uint local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  uVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar6 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar35._4_4_ = uVar6;
  auVar35._0_4_ = uVar1;
  auVar35._8_8_ = 0;
  uVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar7 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar64._4_4_ = uVar7;
  auVar64._0_4_ = uVar2;
  auVar64._8_8_ = 0;
  auVar30 = vinsertps_avx(ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar58 = vinsertps_avx(auVar35,auVar64,0x1c);
  auVar72 = vinsertps_avx(auVar64,auVar35,0x4c);
  auVar48._0_4_ =
       auVar30._0_4_ * auVar30._0_4_ + auVar58._0_4_ * auVar58._0_4_ + auVar72._0_4_ * auVar72._0_4_
  ;
  auVar48._4_4_ =
       auVar30._4_4_ * auVar30._4_4_ + auVar58._4_4_ * auVar58._4_4_ + auVar72._4_4_ * auVar72._4_4_
  ;
  auVar48._8_4_ =
       auVar30._8_4_ * auVar30._8_4_ + auVar58._8_4_ * auVar58._8_4_ + auVar72._8_4_ * auVar72._8_4_
  ;
  auVar48._12_4_ =
       auVar30._12_4_ * auVar30._12_4_ + auVar58._12_4_ * auVar58._12_4_ +
       auVar72._12_4_ * auVar72._12_4_;
  auVar27 = vsqrtps_avx(auVar48);
  fVar61 = auVar27._0_4_;
  auVar72._4_4_ = fVar61;
  auVar72._0_4_ = fVar61;
  auVar72._8_4_ = fVar61;
  auVar72._12_4_ = fVar61;
  auVar30 = vdivps_avx(auVar30,auVar27);
  auVar58 = vmovshdup_avx(auVar27);
  auVar58 = vdivps_avx(auVar64,auVar58);
  auVar72 = vdivps_avx(auVar35,auVar72);
  auVar28 = vmovshdup_avx(auVar30);
  auVar35 = vinsertps_avx(auVar30,auVar58,0x4c);
  auVar24 = vpermi2ps_avx512vl(_DAT_003eee70,auVar30,auVar72);
  auVar48 = vinsertps_avx(auVar58,auVar72,0x4c);
  auVar69._0_4_ = auVar58._0_4_ * auVar24._0_4_;
  auVar69._4_4_ = auVar58._4_4_ * auVar24._4_4_;
  auVar69._8_4_ = auVar58._8_4_ * auVar24._8_4_;
  auVar69._12_4_ = auVar58._12_4_ * auVar24._12_4_;
  auVar35 = vfmsub213ps_fma(auVar35,auVar72,auVar69);
  auVar24 = vfnmadd213ps_fma(auVar24,auVar58,auVar69);
  auVar84._0_4_ = auVar35._0_4_ + auVar24._0_4_;
  auVar84._4_4_ = auVar35._4_4_ + auVar24._4_4_;
  auVar84._8_4_ = auVar35._8_4_ + auVar24._8_4_;
  auVar84._12_4_ = auVar35._12_4_ + auVar24._12_4_;
  auVar24 = ZEXT416((uint)(auVar72._0_4_ * auVar28._0_4_));
  auVar35 = vfmsub213ss_fma(auVar58,auVar30,auVar24);
  auVar28 = vfnmadd213ss_fma(auVar28,auVar72,auVar24);
  fVar31 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar63 = auVar35._0_4_ + auVar28._0_4_;
  fVar23 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  fVar47 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar35 = vinsertps_avx(auVar72,auVar58,0x1c);
  auVar28._0_4_ = auVar35._0_4_ * fVar31;
  auVar28._4_4_ = auVar35._4_4_ * fVar31;
  auVar28._8_4_ = auVar35._8_4_ * fVar31;
  auVar28._12_4_ = auVar35._12_4_ * fVar31;
  auVar76._4_4_ = fVar23;
  auVar76._0_4_ = fVar23;
  auVar76._8_4_ = fVar23;
  auVar76._12_4_ = fVar23;
  auVar35 = vfmadd213ps_fma(auVar76,auVar30,auVar28);
  auVar24._4_4_ = fVar47;
  auVar24._0_4_ = fVar47;
  auVar24._8_4_ = fVar47;
  auVar24._12_4_ = fVar47;
  auVar48 = vfmadd213ps_fma(auVar48,auVar24,auVar35);
  auVar35 = vmovshdup_avx(auVar84);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * auVar35._0_4_)),auVar84,ZEXT416((uint)fVar23));
  auVar35 = vmovshdup_avx(auVar48);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar63),ZEXT416((uint)fVar47));
  fVar31 = auVar28._0_4_;
  auVar73._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
  auVar73._8_4_ = auVar28._8_4_ ^ 0x80000000;
  auVar73._12_4_ = auVar28._12_4_ ^ 0x80000000;
  if (-fVar31 < fVar31) {
    uVar20 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
    auVar84._0_8_ = uVar20 ^ 0x8000000080000000;
    auVar84._8_4_ = -auVar84._8_4_;
    auVar84._12_4_ = -auVar84._12_4_;
  }
  fVar60 = auVar48._0_4_;
  auVar83._0_4_ = fVar60 + fVar61;
  auVar83._4_4_ = auVar48._4_4_ + auVar27._4_4_;
  auVar83._8_4_ = auVar48._8_4_ + auVar27._8_4_;
  auVar83._12_4_ = auVar48._12_4_ + auVar27._12_4_;
  fVar23 = auVar83._0_4_ * auVar35._0_4_;
  auVar12 = vmovshdup_avx(auVar83);
  auVar27 = vblendps_avx(auVar83,auVar48,2);
  auVar24 = vblendps_avx(auVar48,auVar83,2);
  auVar32 = vfnmadd213ss_fma(auVar83,auVar35,ZEXT416((uint)fVar23));
  auVar64 = vfmsub213ss_fma(auVar12,auVar83,ZEXT416((uint)fVar23));
  auVar76 = vminss_avx(auVar73,auVar28);
  fVar61 = auVar76._0_4_;
  auVar87._4_4_ = fVar61;
  auVar87._0_4_ = fVar61;
  auVar87._8_4_ = fVar61;
  auVar87._12_4_ = fVar61;
  fVar47 = fVar60 * fVar61;
  auVar25 = vaddss_avx512f(auVar64,auVar32);
  auVar79._0_4_ = auVar83._0_4_ * fVar61;
  auVar79._4_4_ = auVar83._4_4_ * fVar61;
  auVar79._8_4_ = auVar83._8_4_ * fVar61;
  auVar79._12_4_ = auVar83._12_4_ * fVar61;
  auVar28 = vblendps_avx(auVar83,auVar87,2);
  auVar85._4_12_ = auVar83._4_12_;
  auVar85._0_4_ = fVar61;
  auVar64 = vblendps_avx(auVar12,auVar87,2);
  auVar69 = vinsertps_avx(auVar87,auVar48,0x4c);
  auVar33 = vfnmadd213ss_fma(auVar76,auVar48,ZEXT416((uint)fVar47));
  auVar51._4_4_ = fVar47;
  auVar51._0_4_ = fVar47;
  auVar51._8_4_ = fVar47;
  auVar51._12_4_ = fVar47;
  auVar76 = vfnmadd213ps_fma(auVar85,auVar28,auVar79);
  auVar28 = vfmsub213ps_fma(auVar27,auVar87,auVar79);
  auVar27 = vfmsub213ps_fma(auVar24,auVar87,auVar79);
  auVar26 = vmulss_avx512f(auVar25,auVar25);
  fVar47 = auVar33._0_4_;
  auVar80._0_4_ = auVar27._0_4_ + auVar76._0_4_;
  auVar80._4_4_ = auVar27._4_4_ + auVar76._4_4_;
  auVar80._8_4_ = auVar27._8_4_ + auVar76._8_4_;
  auVar80._12_4_ = auVar27._12_4_ + auVar76._12_4_;
  auVar82._0_4_ = auVar76._0_4_ + auVar28._0_4_;
  auVar82._4_4_ = auVar76._4_4_ + auVar28._4_4_;
  auVar82._8_4_ = auVar76._8_4_ + auVar28._8_4_;
  auVar82._12_4_ = auVar76._12_4_ + auVar28._12_4_;
  auVar86._0_4_ = fVar60 * auVar64._0_4_;
  auVar86._4_4_ = auVar48._4_4_ * auVar64._4_4_;
  auVar86._8_4_ = auVar48._8_4_ * auVar64._8_4_;
  auVar86._12_4_ = auVar48._12_4_ * auVar64._12_4_;
  auVar28 = vinsertps_avx(auVar48,auVar83,0x5c);
  auVar74._4_12_ = auVar86._4_12_;
  auVar74._0_4_ = fVar23;
  auVar24 = vfnmadd213ps_fma(auVar64,auVar48,auVar86);
  auVar27 = vfmsub231ps_fma(auVar74,auVar28,auVar69);
  auVar28 = vinsertps_avx(auVar48,auVar83,0x1c);
  auVar75._0_4_ = auVar27._0_4_ + auVar32._0_4_;
  auVar75._4_4_ = auVar27._4_4_ + auVar24._4_4_;
  auVar75._8_4_ = auVar27._8_4_ + auVar24._8_4_;
  auVar75._12_4_ = auVar27._12_4_ + auVar24._12_4_;
  auVar27 = vshufps_avx(auVar87,auVar83,0xf5);
  auVar28 = vfmsub213ps_fma(auVar28,auVar27,auVar51);
  auVar27._0_4_ = auVar28._0_4_ + fVar47;
  auVar27._4_4_ = auVar28._4_4_ + fVar47;
  auVar27._8_4_ = auVar28._8_4_ + fVar47;
  auVar27._12_4_ = auVar28._12_4_ + fVar47;
  auVar28 = vblendps_avx(auVar48,auVar87,2);
  auVar35 = vfmsub213ps_fma(auVar28,auVar35,auVar86);
  auVar28 = vfmsub231ss_fma(auVar86,auVar83,auVar12);
  auVar32._0_4_ = auVar35._0_4_ + auVar24._0_4_;
  auVar32._4_4_ = auVar35._4_4_ + auVar24._4_4_;
  auVar32._8_4_ = auVar35._8_4_ + auVar24._8_4_;
  auVar32._12_4_ = auVar35._12_4_ + auVar24._12_4_;
  fVar23 = auVar28._0_4_ + auVar24._0_4_;
  auVar35 = vinsertps_avx(auVar32,auVar75,0x4c);
  auVar28 = vinsertps_avx(auVar32,auVar75,0x1c);
  auVar70._0_4_ =
       auVar28._0_4_ * auVar28._0_4_ + auVar35._0_4_ * auVar35._0_4_ + auVar27._0_4_ * auVar27._0_4_
  ;
  auVar70._4_4_ =
       auVar28._4_4_ * auVar28._4_4_ + auVar35._4_4_ * auVar35._4_4_ + auVar27._4_4_ * auVar27._4_4_
  ;
  auVar70._8_4_ =
       auVar28._8_4_ * auVar28._8_4_ + auVar35._8_4_ * auVar35._8_4_ + auVar27._8_4_ * auVar27._8_4_
  ;
  auVar70._12_4_ =
       auVar28._12_4_ * auVar28._12_4_ +
       auVar35._12_4_ * auVar35._12_4_ + auVar27._12_4_ * auVar27._12_4_;
  auVar64 = vsqrtps_avx(auVar70);
  auVar28 = vdivps_avx(auVar27,auVar64);
  auVar33._0_4_ = auVar82._0_4_ * auVar82._0_4_;
  auVar33._4_4_ = auVar82._4_4_ * auVar82._4_4_;
  auVar33._8_4_ = auVar82._8_4_ * auVar82._8_4_;
  auVar33._12_4_ = auVar82._12_4_ * auVar82._12_4_;
  auVar35 = vhaddps_avx(auVar33,auVar33);
  auVar35 = ZEXT416((uint)(auVar26._0_4_ + auVar35._0_4_));
  auVar35 = vsqrtss_avx(auVar35,auVar35);
  auVar69 = vmovshdup_avx(auVar28);
  uVar62 = auVar35._0_4_;
  auVar77._4_4_ = uVar62;
  auVar77._0_4_ = uVar62;
  auVar77._8_4_ = uVar62;
  auVar77._12_4_ = uVar62;
  auVar25 = vdivss_avx512f(auVar25,auVar35);
  auVar65._0_4_ = auVar80._0_4_ * auVar80._0_4_;
  auVar65._4_4_ = auVar80._4_4_ * auVar80._4_4_;
  auVar65._8_4_ = auVar80._8_4_ * auVar80._8_4_;
  auVar65._12_4_ = auVar80._12_4_ * auVar80._12_4_;
  auVar27 = vdivps_avx(auVar82,auVar77);
  auVar35 = vhaddps_avx(auVar65,auVar65);
  auVar35 = ZEXT416((uint)(fVar23 * fVar23 + auVar35._0_4_));
  auVar35 = vsqrtss_avx(auVar35,auVar35);
  auVar76 = vmovshdup_avx(auVar27);
  fVar47 = auVar35._0_4_;
  auVar26._0_4_ = fVar23 / fVar47;
  auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar78._4_4_ = fVar47;
  auVar78._0_4_ = fVar47;
  auVar78._8_4_ = fVar47;
  auVar78._12_4_ = fVar47;
  auVar24 = vdivps_avx(auVar80,auVar78);
  auVar35 = vshufps_avx(auVar64,auVar64,0xe1);
  auVar64 = vdivps_avx(auVar32,auVar64);
  fVar23 = auVar27._0_4_;
  fVar59 = auVar69._0_4_;
  auVar69 = vdivps_avx(auVar75,auVar35);
  auVar32 = vmovshdup_avx(auVar64);
  auVar35 = vfnmsub231ss_fma(ZEXT416((uint)(fVar59 * fVar23)),auVar32,auVar76);
  auVar33 = vfnmadd231ss_fma(auVar35,auVar69,auVar25);
  auVar35 = vblendps_avx(auVar69,auVar64,2);
  fVar47 = auVar25._0_4_;
  if (0.0 <= auVar33._0_4_) {
    fVar81 = fVar47 + auVar35._0_4_;
    fVar68 = auVar27._4_4_ + auVar35._4_4_;
    fVar44 = auVar27._8_4_ + auVar35._8_4_;
    fVar45 = auVar27._12_4_ + auVar35._12_4_;
    auVar52._0_4_ = fVar81 * fVar81;
    auVar52._4_4_ = fVar68 * fVar68;
    auVar52._8_4_ = fVar44 * fVar44;
    auVar52._12_4_ = fVar45 * fVar45;
    auVar33 = vmovshdup_avx(auVar52);
    auVar33 = ZEXT416((uint)(auVar52._0_4_ + auVar33._0_4_ + (fVar59 + fVar23) * (fVar59 + fVar23)))
    ;
    auVar33 = vsqrtss_avx(auVar33,auVar33);
    auVar51 = ZEXT416((uint)(auVar33._0_4_ * 0.5));
    auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
    uVar13 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    local_1bc = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar33._0_4_));
    local_1bc = local_1bc + local_1bc;
  }
  else {
    auVar49._4_12_ = auVar27._4_12_;
    auVar49._0_4_ = fVar47;
    auVar33 = vsubps_avx(auVar49,auVar35);
    auVar50._0_4_ = auVar33._0_4_ * auVar33._0_4_;
    auVar50._4_4_ = auVar33._4_4_ * auVar33._4_4_;
    auVar50._8_4_ = auVar33._8_4_ * auVar33._8_4_;
    auVar50._12_4_ = auVar33._12_4_ * auVar33._12_4_;
    auVar33 = vmovshdup_avx(auVar50);
    auVar33 = ZEXT416((uint)(auVar50._0_4_ + auVar33._0_4_ + (fVar23 - fVar59) * (fVar23 - fVar59)))
    ;
    auVar33 = vsqrtss_avx(auVar33,auVar33);
    auVar51 = ZEXT416((uint)(auVar33._0_4_ * 0.5));
    auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar51);
    uVar13 = vcmpss_avx512f(auVar51,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    auVar39._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar33._0_4_));
    auVar39._4_60_ = extraout_var;
    auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar39._0_16_,ZEXT416(0x40490fdb));
    local_1bc = auVar33._0_4_;
  }
  auVar33 = vmovshdup_avx(auVar24);
  fVar81 = auVar24._0_4_;
  local_58 = auVar76._0_4_;
  auVar76 = vfnmsub231ss_fma(ZEXT416((uint)(fVar81 * fVar23)),auVar33,ZEXT416(local_58));
  auVar76 = vfnmadd231ss_fma(auVar76,auVar25,auVar26);
  if (0.0 <= auVar76._0_4_) {
    fVar68 = auVar24._4_4_ + auVar27._4_4_;
    fVar44 = auVar24._8_4_ + auVar27._8_4_;
    fVar45 = auVar24._12_4_ + auVar27._12_4_;
    auVar25._0_4_ = (auVar26._0_4_ + fVar47) * (auVar26._0_4_ + fVar47);
    auVar25._4_4_ = fVar68 * fVar68;
    auVar25._8_4_ = fVar44 * fVar44;
    auVar25._12_4_ = fVar45 * fVar45;
    auVar27 = vmovshdup_avx(auVar25);
    auVar27 = ZEXT416((uint)(auVar25._0_4_ + auVar27._0_4_ + (fVar81 + fVar23) * (fVar81 + fVar23)))
    ;
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    auVar24 = ZEXT416((uint)(auVar27._0_4_ * 0.5));
    auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
    uVar13 = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    fVar23 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar27._0_4_));
    fVar23 = fVar23 + fVar23;
  }
  else {
    auVar27 = vsubps_avx(auVar24,auVar27);
    auVar34._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar34._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar34._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar34._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar27 = vhaddps_avx(auVar34,auVar34);
    auVar27 = ZEXT416((uint)((auVar26._0_4_ - fVar47) * (auVar26._0_4_ - fVar47) + auVar27._0_4_));
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    auVar24 = ZEXT416((uint)(auVar27._0_4_ * 0.5));
    auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
    uVar13 = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    auVar40._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar27._0_4_));
    auVar40._4_60_ = extraout_var_00;
    auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar40._0_16_,ZEXT416(0x40490fdb));
    fVar23 = auVar27._0_4_;
  }
  local_1a8 = auVar28._0_4_;
  auVar28 = vmovshdup_avx(auVar69);
  auVar27 = vfnmsub231ss_fma(ZEXT416((uint)(local_1a8 * fVar81)),auVar33,auVar28);
  auVar27 = vfnmadd231ss_fma(auVar27,auVar26,auVar64);
  fVar68 = auVar28._0_4_;
  fVar47 = auVar64._0_4_;
  if (0.0 <= auVar27._0_4_) {
    fVar44 = fVar68 + auVar33._0_4_;
    auVar28 = ZEXT416((uint)((fVar47 + auVar26._0_4_) * (fVar47 + auVar26._0_4_) +
                            fVar44 * fVar44 + (local_1a8 + fVar81) * (local_1a8 + fVar81)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar27 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27);
    uVar13 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    fVar81 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar28._0_4_));
    fVar81 = fVar81 + fVar81;
  }
  else {
    fVar44 = fVar68 - auVar33._0_4_;
    auVar28 = ZEXT416((uint)((fVar47 - auVar26._0_4_) * (fVar47 - auVar26._0_4_) +
                            fVar44 * fVar44 + (local_1a8 - fVar81) * (local_1a8 - fVar81)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar27 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27);
    uVar13 = vcmpss_avx512f(auVar27,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    auVar41._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar28._0_4_));
    auVar41._4_60_ = extraout_var_01;
    auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar41._0_16_,ZEXT416(0x40490fdb));
    fVar81 = auVar28._0_4_;
  }
  auVar28 = vfnmsub132ss_fma(auVar32,ZEXT416((uint)(fVar59 * local_1a8)),ZEXT416((uint)fVar68));
  auVar28 = vfnmadd231ss_fma(auVar28,auVar64,auVar69);
  fVar68 = auVar69._0_4_;
  if (0.0 <= auVar28._0_4_) {
    fVar44 = auVar64._4_4_ + auVar69._4_4_;
    fVar45 = auVar64._8_4_ + auVar69._8_4_;
    fVar46 = auVar64._12_4_ + auVar69._12_4_;
    auVar36._0_4_ = (fVar47 + fVar68) * (fVar47 + fVar68);
    auVar36._4_4_ = fVar44 * fVar44;
    auVar36._8_4_ = fVar45 * fVar45;
    auVar36._12_4_ = fVar46 * fVar46;
    auVar35 = vmovshdup_avx(auVar36);
    auVar35 = ZEXT416((uint)(auVar36._0_4_ +
                            auVar35._0_4_ + (fVar59 + local_1a8) * (fVar59 + local_1a8)));
    auVar35 = vsqrtss_avx(auVar35,auVar35);
    auVar28 = ZEXT416((uint)(auVar35._0_4_ * 0.5));
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar28);
    uVar13 = vcmpss_avx512f(auVar28,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    fVar47 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    fVar47 = fVar47 + fVar47;
  }
  else {
    auVar28 = vblendps_avx(auVar64,auVar69,2);
    auVar35 = vsubps_avx(auVar35,auVar28);
    auVar53._0_4_ = auVar35._0_4_ * auVar35._0_4_;
    auVar53._4_4_ = auVar35._4_4_ * auVar35._4_4_;
    auVar53._8_4_ = auVar35._8_4_ * auVar35._8_4_;
    auVar53._12_4_ = auVar35._12_4_ * auVar35._12_4_;
    auVar35 = vmovshdup_avx(auVar53);
    auVar35 = ZEXT416((uint)(auVar53._0_4_ +
                            auVar35._0_4_ + (fVar59 - local_1a8) * (fVar59 - local_1a8)));
    auVar35 = vsqrtss_avx(auVar35,auVar35);
    auVar28 = ZEXT416((uint)(auVar35._0_4_ * 0.5));
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar28);
    uVar13 = vcmpss_avx512f(auVar28,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar13 & 1);
    auVar42._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    auVar42._4_60_ = extraout_var_02;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar42._0_16_,ZEXT416(0x40490fdb));
    fVar47 = auVar35._0_4_;
  }
  if (SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
      ::reg == '\0') {
    iVar22 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                                  ::reg);
    if (iVar22 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                  ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                        Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                        Vector3<float>const&,pbrt::Point2<float>,float*)::$_0::__invoke(pbrt::
                        StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                           ::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
  dVar11 = (double)local_1bc + (double)fVar23 + (double)fVar81 + (double)fVar47 +
           -6.2831854820251465;
  auVar37._0_4_ = (float)dVar11;
  auVar37._4_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar37._8_8_ = 0;
  if (auVar37._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar54._0_4_ = 1.0 / auVar37._0_4_;
      auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar35 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
      *pdf = auVar35._0_4_;
    }
    if (0.001 <= auVar37._0_4_) {
      uVar13 = vcmpss_avx512f(auVar73,ZEXT416((uint)fVar31),1);
      bVar14 = (bool)((byte)uVar13 & 1);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar27 = vxorps_avx512vl(ZEXT416((uint)fVar63),auVar16);
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar28 = vxorps_avx512vl(auVar26,auVar17);
      auVar21._8_8_ = in_XMM0_Qb;
      auVar21._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
      auVar35 = vfmsub213ss_fma(auVar37,auVar21,ZEXT416((uint)fVar81));
      fVar47 = auVar35._0_4_ - fVar47;
      auVar43._0_4_ = cosf(fVar47);
      auVar43._4_60_ = extraout_var_03;
      local_1b8 = auVar28._0_4_;
      auVar35 = vfmadd213ss_fma(auVar43._0_16_,auVar69,ZEXT416(local_1b8));
      fVar31 = sinf(fVar47);
      fVar81 = auVar12._0_4_;
      auVar55._0_4_ = auVar35._0_4_ / fVar31;
      auVar55._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar35 = ZEXT416((uint)(fVar68 * fVar68 + auVar55._0_4_ * auVar55._0_4_));
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar28 = vpternlogd_avx512vl(ZEXT416((uint)(1.0 / auVar35._0_4_)),auVar55,auVar18,0xe4);
      auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar28);
      uVar13 = vcmpss_avx512f(auVar28,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar15 = (bool)((byte)uVar13 & 1);
      auVar29._4_12_ = auVar35._4_12_;
      auVar29._0_4_ = (float)((uint)bVar15 * -0x40800001 + (uint)!bVar15 * auVar35._0_4_);
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      auVar28 = vxorps_avx512vl(auVar29,auVar19);
      auVar56._0_12_ = ZEXT812(0);
      auVar56._12_4_ = 0;
      auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar29._0_4_ * auVar29._0_4_)),auVar56);
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      auVar66._0_4_ = (fVar61 * auVar28._0_4_) / auVar35._0_4_;
      auVar66._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar35 = vminss_avx(auVar83,auVar66);
      uVar13 = vcmpss_avx512f(auVar66,auVar48,1);
      bVar15 = (bool)((byte)uVar13 & 1);
      fVar23 = (float)((uint)bVar15 * (int)fVar60 + (uint)!bVar15 * auVar35._0_4_);
      auVar35 = vblendps_avx(auVar12,auVar48,2);
      auVar48 = ZEXT416((uint)(fVar61 * fVar61 + fVar23 * fVar23));
      auVar48 = vsqrtss_avx(auVar48,auVar48);
      fVar47 = auVar48._0_4_;
      fVar31 = fVar47 * fVar47;
      auVar71._0_4_ = auVar35._0_4_ * auVar35._0_4_ + fVar31;
      auVar71._4_4_ = auVar35._4_4_ * auVar35._4_4_ + fVar31;
      auVar71._8_4_ = auVar35._8_4_ * auVar35._8_4_ + fVar31;
      auVar71._12_4_ = auVar35._12_4_ * auVar35._12_4_ + fVar31;
      auVar12._8_8_ = in_XMM0_Qb;
      auVar12._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
      auVar28 = vmovshdup_avx(auVar12);
      auVar48 = vsqrtps_avx(auVar71);
      auVar35 = vdivps_avx(auVar35,auVar48);
      auVar48 = vhsubps_avx(auVar35,auVar35);
      auVar35 = vmovshdup_avx(auVar35);
      auVar35 = vfmadd213ss_fma(auVar48,auVar28,auVar35);
      fVar31 = auVar35._0_4_;
      if (fVar31 * fVar31 < 0.999999) {
        fVar59 = 1.0 - fVar31 * fVar31;
        if (fVar59 < 0.0) {
          fVar81 = sqrtf(fVar59);
        }
        else {
          auVar35 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
          fVar81 = auVar35._0_4_;
        }
        fVar81 = (fVar47 * fVar31) / fVar81;
      }
      auVar38._4_4_ = fVar23;
      auVar38._0_4_ = fVar23;
      auVar38._8_4_ = fVar23;
      auVar38._12_4_ = fVar23;
      auVar57._4_4_ = fVar81;
      auVar57._0_4_ = fVar81;
      auVar57._8_4_ = fVar81;
      auVar57._12_4_ = fVar81;
      auVar35 = vblendps_avx(auVar38,auVar57,2);
      local_98 = auVar30._0_4_;
      fStack_94 = auVar30._4_4_;
      fStack_90 = auVar30._8_4_;
      fStack_8c = auVar30._12_4_;
      auVar67._0_4_ = auVar35._0_4_ * local_98;
      auVar67._4_4_ = auVar35._4_4_ * fStack_94;
      auVar67._8_4_ = auVar35._8_4_ * fStack_90;
      auVar67._12_4_ = auVar35._12_4_ * fStack_8c;
      fStack_84 = auVar72._4_4_;
      fStack_80 = auVar72._8_4_;
      fStack_7c = auVar72._12_4_;
      auVar30 = vhaddps_avx(auVar67,auVar67);
      fVar31 = auVar84._0_4_ * fVar61 + auVar30._0_4_ + (pRef->super_Tuple3<pbrt::Point3,_float>).x;
      auVar30 = vpermi2ps_avx512vl(_DAT_003eee60,auVar84,
                                   ZEXT416((uint)bVar14 * auVar27._0_4_ +
                                           (uint)!bVar14 * (int)fVar63));
      fVar47 = auVar30._0_4_ * fVar61 + fVar23 * auVar72._0_4_ + fVar81 * auVar58._0_4_;
      fVar59 = auVar30._4_4_ * fVar61 + fVar23 * fStack_84 + fVar81 * auVar58._4_4_;
      fVar60 = auVar30._8_4_ * fVar61 + fVar23 * fStack_80 + fVar81 * auVar58._8_4_;
      fVar61 = auVar30._12_4_ * fVar61 + fVar23 * fStack_7c + fVar81 * auVar58._12_4_;
      fVar63 = (pRef->super_Tuple3<pbrt::Point3,_float>).y;
      fVar23 = (pRef->super_Tuple3<pbrt::Point3,_float>).z;
      fVar81 = 0.0;
      fVar68 = 0.0;
      goto LAB_002793e3;
    }
  }
  auVar30._8_8_ = in_XMM0_Qb;
  auVar30._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  uVar3 = (s->super_Tuple3<pbrt::Point3,_float>).y;
  uVar8 = (s->super_Tuple3<pbrt::Point3,_float>).z;
  uVar4 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar9 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar68 = u.super_Tuple2<pbrt::Point2,_float>.x;
  auVar30 = vmovshdup_avx(auVar30);
  fVar47 = auVar30._0_4_ * (float)uVar4;
  fVar59 = auVar30._4_4_ * (float)uVar9;
  fVar60 = auVar30._8_4_ * 0.0;
  fVar61 = auVar30._12_4_ * 0.0;
  fVar31 = fVar68 * (ex->super_Tuple3<pbrt::Vector3,_float>).x +
           (s->super_Tuple3<pbrt::Point3,_float>).x +
           auVar30._0_4_ * (ey->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar5 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar10 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar63 = fVar68 * (float)uVar5 + (float)uVar3;
  fVar23 = fVar68 * (float)uVar10 + (float)uVar8;
  fVar81 = fVar68 * 0.0 + 0.0;
  fVar68 = fVar68 * 0.0 + 0.0;
LAB_002793e3:
  auVar58._0_4_ = fVar63 + fVar47;
  auVar58._4_4_ = fVar23 + fVar59;
  auVar58._8_4_ = fVar81 + fVar60;
  auVar58._12_4_ = fVar68 + fVar61;
  auVar30 = vinsertps_avx(ZEXT416((uint)fVar31),auVar58,0x1c);
  auVar58 = vmovshdup_avx(auVar58);
  PVar88.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar30._0_8_;
  PVar88.super_Tuple3<pbrt::Point3,_float>.z = auVar58._0_4_;
  return (Point3f)PVar88.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, Point2f u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}